

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::giveErrorOnExternalKeyword(StructuralParser *this)

{
  char *__s1;
  int iVar1;
  CompileMessage local_48;
  
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 != "external") {
    if (__s1 == (char *)0x0) {
      return;
    }
    iVar1 = strcmp(__s1,"external");
    if (iVar1 != 0) {
      return;
    }
  }
  CompileMessageHelpers::createMessage<>
            (&local_48,syntax,error,"The \'external\' flag can only be applied to state variables");
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_48);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
    operator_delete(local_48.description._M_dataplus._M_p,
                    local_48.description.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void giveErrorOnExternalKeyword()
    {
        if (matches (Keyword::external))
            throwError (Errors::externalOnlyAllowedOnStateVars());
    }